

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UriQuery.c
# Opt level: O1

wchar_t uriDissectQueryMallocExMmA
                  (UriQueryListA **dest,wchar_t *itemCount,char *first,char *afterLast,
                  UriBool plusToSpace,UriBreakConversion breakConversion,UriMemoryManager *memory)

{
  char *pcVar1;
  UriBool UVar2;
  char *pcVar3;
  wchar_t wVar4;
  char *valueFirst;
  char *valueAfter;
  char *pcVar5;
  wchar_t *itemCount_00;
  UriQueryListStructA **ppUVar6;
  UriMemoryManager *local_48;
  wchar_t nullCounter;
  
  itemCount_00 = &nullCounter;
  if (itemCount != (wchar_t *)0x0) {
    itemCount_00 = itemCount;
  }
  wVar4 = L'\x02';
  if ((afterLast != (char *)0x0 && (first != (char *)0x0 && dest != (UriQueryListA **)0x0)) &&
     (wVar4 = L'\t', first <= afterLast)) {
    if (memory == (UriMemoryManager *)0x0) {
      local_48 = &defaultMemoryManager;
    }
    else {
      local_48 = memory;
      UVar2 = uriMemoryManagerIsComplete(memory);
      if (UVar2 != 1) {
        return L'\n';
      }
    }
    *dest = (UriQueryListA *)0x0;
    *itemCount_00 = L'\0';
    pcVar5 = first;
    ppUVar6 = dest;
    if (first < afterLast) {
      valueAfter = (char *)0x0;
      valueFirst = (char *)0x0;
      pcVar3 = (char *)0x0;
      do {
        if (*pcVar5 == '=') {
          if ((pcVar3 == (char *)0x0) && (pcVar1 = pcVar5 + 1, pcVar3 = pcVar5, pcVar1 <= afterLast)
             ) {
            valueFirst = pcVar1;
            valueAfter = pcVar1;
          }
        }
        else if (*pcVar5 == '&') {
          pcVar1 = pcVar5;
          if (valueFirst != (char *)0x0) {
            valueAfter = pcVar5;
            pcVar1 = pcVar3;
          }
          UVar2 = uriAppendQueryItemA(ppUVar6,itemCount_00,first,pcVar1,valueFirst,valueAfter,
                                      plusToSpace,breakConversion,local_48);
          if (UVar2 == 0) goto LAB_001b7207;
          if (ppUVar6 == (UriQueryListStructA **)0x0) {
            ppUVar6 = (UriQueryListStructA **)0x0;
          }
          else if (*ppUVar6 != (UriQueryListA *)0x0) {
            ppUVar6 = &(*ppUVar6)->next;
          }
          first = pcVar5 + 1;
          if (afterLast <= first) {
            first = (char *)0x0;
          }
          pcVar3 = (char *)0x0;
          valueFirst = (char *)0x0;
          valueAfter = (char *)0x0;
        }
        pcVar5 = pcVar5 + 1;
      } while (pcVar5 != afterLast);
    }
    else {
      pcVar3 = (char *)0x0;
      valueFirst = (char *)0x0;
      valueAfter = (char *)0x0;
    }
    wVar4 = L'\0';
    if (valueFirst != (char *)0x0) {
      valueAfter = pcVar5;
      pcVar5 = pcVar3;
    }
    UVar2 = uriAppendQueryItemA(ppUVar6,itemCount_00,first,pcVar5,valueFirst,valueAfter,plusToSpace,
                                breakConversion,local_48);
    if (UVar2 == 0) {
LAB_001b7207:
      *itemCount_00 = L'\0';
      uriFreeQueryListMmA(*dest,local_48);
      wVar4 = L'\x03';
    }
  }
  return wVar4;
}

Assistant:

int URI_FUNC(DissectQueryMallocExMm)(URI_TYPE(QueryList) ** dest, int * itemCount,
		const URI_CHAR * first, const URI_CHAR * afterLast,
		UriBool plusToSpace, UriBreakConversion breakConversion,
		UriMemoryManager * memory) {
	const URI_CHAR * walk = first;
	const URI_CHAR * keyFirst = first;
	const URI_CHAR * keyAfter = NULL;
	const URI_CHAR * valueFirst = NULL;
	const URI_CHAR * valueAfter = NULL;
	URI_TYPE(QueryList) ** prevNext = dest;
	int nullCounter;
	int * itemsAppended = (itemCount == NULL) ? &nullCounter : itemCount;

	if ((dest == NULL) || (first == NULL) || (afterLast == NULL)) {
		return URI_ERROR_NULL;
	}

	if (first > afterLast) {
		return URI_ERROR_RANGE_INVALID;
	}

	URI_CHECK_MEMORY_MANAGER(memory);  /* may return */

	*dest = NULL;
	*itemsAppended = 0;

	/* Parse query string */
	for (; walk < afterLast; walk++) {
		switch (*walk) {
		case _UT('&'):
			if (valueFirst != NULL) {
				valueAfter = walk;
			} else {
				keyAfter = walk;
			}

			if (URI_FUNC(AppendQueryItem)(prevNext, itemsAppended,
					keyFirst, keyAfter, valueFirst, valueAfter,
					plusToSpace, breakConversion, memory)
					== URI_FALSE) {
				/* Free list we built */
				*itemsAppended = 0;
				URI_FUNC(FreeQueryListMm)(*dest, memory);
				return URI_ERROR_MALLOC;
			}

			/* Make future items children of the current */
			if ((prevNext != NULL) && (*prevNext != NULL)) {
				prevNext = &((*prevNext)->next);
			}

			if (walk + 1 < afterLast) {
				keyFirst = walk + 1;
			} else {
				keyFirst = NULL;
			}
			keyAfter = NULL;
			valueFirst = NULL;
			valueAfter = NULL;
			break;

		case _UT('='):
			/* NOTE: WE treat the first '=' as a separator, */
			/*       all following go into the value part   */
			if (keyAfter == NULL) {
				keyAfter = walk;
				if (walk + 1 <= afterLast) {
					valueFirst = walk + 1;
					valueAfter = walk + 1;
				}
			}
			break;

		default:
			break;
		}
	}

	if (valueFirst != NULL) {
		/* Must be key/value pair */
		valueAfter = walk;
	} else {
		/* Must be key only */
		keyAfter = walk;
	}

	if (URI_FUNC(AppendQueryItem)(prevNext, itemsAppended, keyFirst, keyAfter,
			valueFirst, valueAfter, plusToSpace, breakConversion, memory)
			== URI_FALSE) {
		/* Free list we built */
		*itemsAppended = 0;
		URI_FUNC(FreeQueryListMm)(*dest, memory);
		return URI_ERROR_MALLOC;
	}

	return URI_SUCCESS;
}